

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_dest(ASMState *as,IRIns *ir,RegSet allow)

{
  byte bVar1;
  uint local_20;
  Reg dest;
  RegSet allow_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  bVar1 = (ir->field_1).r;
  local_20 = (uint)bVar1;
  if ((bVar1 & 0x80) == 0) {
    as->freeset = 1 << (bVar1 & 0x1f) | as->freeset;
    as->modset = 1 << (bVar1 & 0x1f) | as->modset;
  }
  else {
    if ((local_20 < 0xfd) && (((as->freeset & allow) >> (bVar1 & 0x1f) & 1) != 0)) {
      local_20 = local_20 & 0x7f;
      as->modset = 1 << ((byte)local_20 & 0x1f) | as->modset;
    }
    else {
      local_20 = ra_scratch(as,allow);
    }
    (ir->field_1).r = (uint8_t)local_20;
  }
  if ((ir->field_1).s != '\0') {
    ra_save(as,ir,local_20);
  }
  return local_20;
}

Assistant:

static Reg ra_dest(ASMState *as, IRIns *ir, RegSet allow)
{
  Reg dest = ir->r;
  if (ra_hasreg(dest)) {
    ra_free(as, dest);
    ra_modified(as, dest);
  } else {
    if (ra_hashint(dest) && rset_test((as->freeset&allow), ra_gethint(dest))) {
      dest = ra_gethint(dest);
      ra_modified(as, dest);
      RA_DBGX((as, "dest           $r", dest));
    } else {
      dest = ra_scratch(as, allow);
    }
    ir->r = dest;
  }
  if (LJ_UNLIKELY(ra_hasspill(ir->s))) ra_save(as, ir, dest);
  return dest;
}